

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O2

void __thiscall QProxyStylePrivate::ensureBaseStyle(QProxyStylePrivate *this)

{
  QPointer<QStyle> *this_00;
  QStyle *style;
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  QObject *pQVar4;
  char *pcVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  style = *(QStyle **)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x8;
  this_00 = &this->baseStyle;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (!bVar2) {
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if ((!bVar2) && (_topLevelAt != 0)) {
      pQVar4 = &QStyleFactory::create((QString *)&QGuiApplicationPrivate::styleOverride)->
                super_QObject;
      QWeakPointer<QObject>::assign<QObject>(&this_00->wp,pQVar4);
      bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
      if (bVar2) {
        (*(code *)**(undefined8 **)(this->baseStyle).wp.value)();
        pcVar5 = (char *)QMetaObject::className();
        (*(code *)**(undefined8 **)style)(style);
        pcVar6 = (char *)QMetaObject::className();
        iVar3 = qstrcmp(pcVar5,pcVar6);
        if (iVar3 == 0) {
          pDVar1 = (this_00->wp).d;
          if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
             (pQVar4 = (this->baseStyle).wp.value, pQVar4 != (QObject *)0x0)) {
            (**(code **)(*(long *)pQVar4 + 0x20))();
          }
          QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)0x0);
        }
      }
    }
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (!bVar2) {
      QApplicationPrivate::desktopStyleKey();
      pQVar4 = &QStyleFactory::create((QString *)&local_40)->super_QObject;
      QWeakPointer<QObject>::assign<QObject>(&this_00->wp,pQVar4);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (!bVar2) {
      latin1.m_data = "windows";
      latin1.m_size = 7;
      QString::QString((QString *)&local_40,latin1);
      pQVar4 = &QStyleFactory::create((QString *)&local_40)->super_QObject;
      QWeakPointer<QObject>::assign<QObject>(&this_00->wp,pQVar4);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
    QStyle::setProxy((QStyle *)(this->baseStyle).wp.value,style);
    QObject::setParent((this->baseStyle).wp.value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProxyStylePrivate::ensureBaseStyle() const
{
    Q_Q(const QProxyStyle);

    if (baseStyle)
        return;

    if (!baseStyle && !QApplicationPrivate::styleOverride.isEmpty()) {
        baseStyle = QStyleFactory::create(QApplicationPrivate::styleOverride);
        if (baseStyle) {
            // If baseStyle is an instance of the same proxyStyle
            // we destroy it and fall back to the desktop style
            if (qstrcmp(baseStyle->metaObject()->className(),
                        q->metaObject()->className()) == 0) {
                delete baseStyle;
                baseStyle = nullptr;
            }
        }
    }

    if (!baseStyle) // Use application desktop style
        baseStyle = QStyleFactory::create(QApplicationPrivate::desktopStyleKey());

    if (!baseStyle) // Fallback to windows style
        baseStyle = QStyleFactory::create("windows"_L1);

    baseStyle->setProxy(const_cast<QProxyStyle*>(q));
    baseStyle->setParent(const_cast<QProxyStyle*>(q)); // Take ownership
}